

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::Open(Benchmark *this)

{
  sqlite3 *psVar1;
  FILE *__stream;
  Env *pEVar2;
  undefined8 uVar3;
  string *local_2a8;
  int local_270;
  int i;
  int stmt_array_length;
  string asStack_248 [32];
  string asStack_228 [7];
  allocator local_221;
  string local_220 [8];
  string create_stmt;
  allocator local_1f9;
  string local_1f8 [8];
  string locking_stmt;
  allocator local_1d1;
  string local_1d0 [8];
  string WAL_checkpoint;
  allocator local_1a9;
  string local_1a8 [8];
  string WAL_stmt;
  char local_188 [8];
  char page_size [100];
  char local_118 [8];
  char cache_size [100];
  Status local_a8;
  string local_a0 [8];
  string tmp_dir;
  char *local_80;
  char *err_msg;
  char file_name [100];
  int status;
  Benchmark *this_local;
  
  unique0x10000588 = this;
  if (this->db_ != (sqlite3 *)0x0) {
    __assert_fail("db_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/benchmarks/db_bench_sqlite3.cc"
                  ,0x1a6,"void leveldb::Benchmark::Open()");
  }
  local_80 = (char *)0x0;
  this->db_num_ = this->db_num_ + 1;
  std::__cxx11::string::string(local_a0);
  pEVar2 = Env::Default();
  (*pEVar2->_vptr_Env[0x13])(&local_a8,pEVar2,local_a0);
  Status::~Status(&local_a8);
  uVar3 = std::__cxx11::string::c_str();
  snprintf((char *)&err_msg,100,"%s/dbbench_sqlite3-%d.db",uVar3,(ulong)(uint)this->db_num_);
  file_name._92_4_ = sqlite3_open(&err_msg,this);
  __stream = _stderr;
  if (file_name._92_4_ != 0) {
    uVar3 = sqlite3_errmsg(this->db_);
    fprintf(__stream,"open error: %s\n",uVar3);
    exit(1);
  }
  snprintf(local_118,100,"PRAGMA cache_size = %d",(ulong)(uint)FLAGS_num_pages);
  file_name._92_4_ = sqlite3_exec(this->db_,local_118,0,0,&local_80);
  ExecErrorCheck(file_name._92_4_,local_80);
  if (FLAGS_page_size != 0x400) {
    snprintf(local_188,100,"PRAGMA page_size = %d",(ulong)(uint)FLAGS_page_size);
    file_name._92_4_ = sqlite3_exec(this->db_,local_188,0,0,&local_80);
    ExecErrorCheck(file_name._92_4_,local_80);
  }
  if ((FLAGS_WAL_enabled & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"PRAGMA journal_mode = WAL",&local_1a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"PRAGMA wal_autocheckpoint = 4096",&local_1d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    psVar1 = this->db_;
    uVar3 = std::__cxx11::string::c_str();
    file_name._92_4_ = sqlite3_exec(psVar1,uVar3,0,0,&local_80);
    ExecErrorCheck(file_name._92_4_,local_80);
    psVar1 = this->db_;
    uVar3 = std::__cxx11::string::c_str();
    file_name._92_4_ = sqlite3_exec(psVar1,uVar3,0,0,&local_80);
    ExecErrorCheck(file_name._92_4_,local_80);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_1a8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"PRAGMA locking_mode = EXCLUSIVE",&local_1f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,"CREATE TABLE test (key blob, value blob, PRIMARY KEY(key))",&local_221);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  if ((FLAGS_use_rowids & 1U) == 0) {
    std::__cxx11::string::operator+=(local_220," WITHOUT ROWID");
  }
  std::__cxx11::string::string((string *)&i,local_1f8);
  std::__cxx11::string::string(asStack_248,local_220);
  for (local_270 = 0; local_270 < 2; local_270 = local_270 + 1) {
    psVar1 = this->db_;
    uVar3 = std::__cxx11::string::c_str();
    file_name._92_4_ = sqlite3_exec(psVar1,uVar3,0,0,&local_80);
    ExecErrorCheck(file_name._92_4_,local_80);
  }
  local_2a8 = asStack_228;
  do {
    local_2a8 = local_2a8 + -0x20;
    std::__cxx11::string::~string(local_2a8);
  } while (local_2a8 != (string *)&i);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

void Open() {
    assert(db_ == nullptr);

    int status;
    char file_name[100];
    char* err_msg = nullptr;
    db_num_++;

    // Open database
    std::string tmp_dir;
    Env::Default()->GetTestDirectory(&tmp_dir);
    std::snprintf(file_name, sizeof(file_name), "%s/dbbench_sqlite3-%d.db",
                  tmp_dir.c_str(), db_num_);
    status = sqlite3_open(file_name, &db_);
    if (status) {
      std::fprintf(stderr, "open error: %s\n", sqlite3_errmsg(db_));
      std::exit(1);
    }

    // Change SQLite cache size
    char cache_size[100];
    std::snprintf(cache_size, sizeof(cache_size), "PRAGMA cache_size = %d",
                  FLAGS_num_pages);
    status = sqlite3_exec(db_, cache_size, nullptr, nullptr, &err_msg);
    ExecErrorCheck(status, err_msg);

    // FLAGS_page_size is defaulted to 1024
    if (FLAGS_page_size != 1024) {
      char page_size[100];
      std::snprintf(page_size, sizeof(page_size), "PRAGMA page_size = %d",
                    FLAGS_page_size);
      status = sqlite3_exec(db_, page_size, nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
    }

    // Change journal mode to WAL if WAL enabled flag is on
    if (FLAGS_WAL_enabled) {
      std::string WAL_stmt = "PRAGMA journal_mode = WAL";

      // LevelDB's default cache size is a combined 4 MB
      std::string WAL_checkpoint = "PRAGMA wal_autocheckpoint = 4096";
      status = sqlite3_exec(db_, WAL_stmt.c_str(), nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
      status =
          sqlite3_exec(db_, WAL_checkpoint.c_str(), nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
    }

    // Change locking mode to exclusive and create tables/index for database
    std::string locking_stmt = "PRAGMA locking_mode = EXCLUSIVE";
    std::string create_stmt =
        "CREATE TABLE test (key blob, value blob, PRIMARY KEY(key))";
    if (!FLAGS_use_rowids) create_stmt += " WITHOUT ROWID";
    std::string stmt_array[] = {locking_stmt, create_stmt};
    int stmt_array_length = sizeof(stmt_array) / sizeof(std::string);
    for (int i = 0; i < stmt_array_length; i++) {
      status =
          sqlite3_exec(db_, stmt_array[i].c_str(), nullptr, nullptr, &err_msg);
      ExecErrorCheck(status, err_msg);
    }
  }